

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font_config * nk_font_config(nk_font_config *__return_storage_ptr__,float pixel_height)

{
  nk_zero(__return_storage_ptr__,0x58);
  __return_storage_ptr__->ttf_blob = (void *)0x0;
  __return_storage_ptr__->ttf_size = 0;
  __return_storage_ptr__->ttf_data_owned_by_atlas = '\0';
  __return_storage_ptr__->merge_mode = '\0';
  __return_storage_ptr__->pixel_snap = '\0';
  __return_storage_ptr__->oversample_v = '\x01';
  __return_storage_ptr__->size = pixel_height;
  __return_storage_ptr__->oversample_h = '\x03';
  __return_storage_ptr__->coord_type = NK_COORD_UV;
  (__return_storage_ptr__->spacing).x = 0.0;
  (__return_storage_ptr__->spacing).y = 0.0;
  __return_storage_ptr__->range = nk_font_default_glyph_ranges::ranges;
  __return_storage_ptr__->fallback_glyph = 0x3f;
  __return_storage_ptr__->font = (nk_baked_font *)0x0;
  __return_storage_ptr__->n = (nk_font_config *)0x0;
  return __return_storage_ptr__;
}

Assistant:

NK_API struct nk_font_config
nk_font_config(float pixel_height)
{
    struct nk_font_config cfg;
    nk_zero_struct(cfg);
    cfg.ttf_blob = 0;
    cfg.ttf_size = 0;
    cfg.ttf_data_owned_by_atlas = 0;
    cfg.size = pixel_height;
    cfg.oversample_h = 3;
    cfg.oversample_v = 1;
    cfg.pixel_snap = 0;
    cfg.coord_type = NK_COORD_UV;
    cfg.spacing = nk_vec2(0,0);
    cfg.range = nk_font_default_glyph_ranges();
    cfg.merge_mode = 0;
    cfg.fallback_glyph = '?';
    cfg.font = 0;
    cfg.n = 0;
    return cfg;
}